

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_read_compressed_img
              (fitsfile *fptr,int datatype,LONGLONG *infpixel,LONGLONG *inlpixel,long *ininc,
              int nullcheck,void *nullval,void *array,char *nullarray,int *anynul,int *status)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  long local_350;
  double local_348;
  double testnullval;
  char *bnullarray;
  void *buffer;
  int tilenul;
  int pixlen;
  int ndim;
  int ii;
  long irow;
  long i0;
  long i1;
  long i2;
  long i3;
  long i4;
  long i5;
  long inc [6];
  long lpixel [6];
  long fpixel [6];
  long local_250;
  long ntemp;
  long offset [6];
  long rowdim [6];
  long tlpixel [6];
  long tfpixel [6];
  long ltile [6];
  long ftile [6];
  long thistilesize [6];
  long tilesize [6];
  long tiledim [6];
  long naxis [6];
  int local_5c;
  int nullcheck_local;
  long *ininc_local;
  LONGLONG *inlpixel_local;
  LONGLONG *infpixel_local;
  int datatype_local;
  fitsfile *fptr_local;
  
  buffer._0_4_ = 0;
  testnullval = 0.0;
  local_348 = 0.0;
  if (*status < 1) {
    iVar3 = fits_is_compressed_image(fptr,status);
    if (iVar3 == 0) {
      ffpmsg("CHDU is not a compressed image (fits_read_compressed_img)");
      *status = 0x19e;
      fptr_local._4_4_ = 0x19e;
    }
    else {
      if (datatype == 0x15) {
        bnullarray = (char *)malloc(fptr->Fptr->maxtilelen << 1);
        buffer._4_4_ = 2;
        if (nullval != (void *)0x0) {
          local_348 = (double)(int)*nullval;
        }
      }
      else if (datatype == 0x1f) {
        bnullarray = (char *)malloc(fptr->Fptr->maxtilelen << 2);
        buffer._4_4_ = 4;
        if (nullval != (void *)0x0) {
          local_348 = (double)*nullval;
        }
      }
      else if (datatype == 0x29) {
        bnullarray = (char *)malloc(fptr->Fptr->maxtilelen << 3);
        buffer._4_4_ = 8;
        if (nullval != (void *)0x0) {
          local_348 = (double)*nullval;
        }
      }
      else if (datatype == 0x2a) {
        bnullarray = (char *)malloc(fptr->Fptr->maxtilelen << 2);
        buffer._4_4_ = 4;
        if (nullval != (void *)0x0) {
          local_348 = (double)*nullval;
        }
      }
      else if (datatype == 0x52) {
        bnullarray = (char *)malloc(fptr->Fptr->maxtilelen << 3);
        buffer._4_4_ = 8;
        if (nullval != (void *)0x0) {
          local_348 = *nullval;
        }
      }
      else if (datatype == 0x14) {
        bnullarray = (char *)malloc(fptr->Fptr->maxtilelen << 1);
        buffer._4_4_ = 2;
        if (nullval != (void *)0x0) {
          local_348 = (double)*nullval;
        }
      }
      else if (datatype == 0x1e) {
        bnullarray = (char *)malloc(fptr->Fptr->maxtilelen << 2);
        buffer._4_4_ = 4;
        if (nullval != (void *)0x0) {
          local_348 = (double)*nullval;
        }
      }
      else if (datatype == 0x28) {
        bnullarray = (char *)malloc(fptr->Fptr->maxtilelen << 3);
        buffer._4_4_ = 8;
        if (nullval != (void *)0x0) {
          uVar1 = *nullval;
          auVar5._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar5._0_8_ = uVar1;
          auVar5._12_4_ = 0x45300000;
          local_348 = (auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        }
      }
      else {
        if ((datatype != 0xb) && (datatype != 0xc)) {
          ffpmsg("unsupported datatype for uncompressing image");
          *status = 0x19a;
          return 0x19a;
        }
        bnullarray = (char *)malloc(fptr->Fptr->maxtilelen);
        buffer._4_4_ = 1;
        if (nullval != (void *)0x0) {
          local_348 = (double)*nullval;
        }
      }
      local_5c = nullcheck;
      if (((nullcheck == 1) && (local_348 == 0.0)) && (!NAN(local_348))) {
        local_5c = 0;
      }
      if (bnullarray == (char *)0x0) {
        ffpmsg("Out of memory (fits_read_compress_img)");
        *status = 0x71;
        fptr_local._4_4_ = 0x71;
      }
      else if ((local_5c == 2) &&
              (testnullval = (double)calloc(fptr->Fptr->maxtilelen,1),
              (void *)testnullval == (void *)0x0)) {
        ffpmsg("Out of memory (fits_read_compress_img)");
        free(bnullarray);
        *status = 0x71;
        fptr_local._4_4_ = 0x71;
      }
      else {
        for (pixlen = 0; pixlen < 6; pixlen = pixlen + 1) {
          tiledim[(long)pixlen + 5] = 1;
          tilesize[(long)pixlen + 5] = 1;
          thistilesize[(long)pixlen + 5] = 1;
          ltile[(long)pixlen + 5] = 1;
          tfpixel[(long)pixlen + 5] = 1;
          offset[(long)pixlen + 5] = 1;
        }
        tilenul = fptr->Fptr->zndim;
        local_250 = 1;
        for (pixlen = 0; pixlen < tilenul; pixlen = pixlen + 1) {
          if (inlpixel[pixlen] < infpixel[pixlen]) {
            lpixel[(long)pixlen + 5] = inlpixel[pixlen];
            inc[(long)pixlen + 5] = infpixel[pixlen];
            inc[(long)pixlen + -1] = -ininc[pixlen];
          }
          else {
            lpixel[(long)pixlen + 5] = infpixel[pixlen];
            inc[(long)pixlen + 5] = inlpixel[pixlen];
            inc[(long)pixlen + -1] = ininc[pixlen];
          }
          tiledim[(long)pixlen + 5] = fptr->Fptr->znaxis[pixlen];
          if (lpixel[(long)pixlen + 5] < 1) {
            if (local_5c == 2) {
              free((void *)testnullval);
            }
            free(bnullarray);
            *status = 0x141;
            return 0x141;
          }
          thistilesize[(long)pixlen + 5] = fptr->Fptr->tilesize[pixlen];
          tilesize[(long)pixlen + 5] =
               (tiledim[(long)pixlen + 5] + -1) / thistilesize[(long)pixlen + 5] + 1;
          ltile[(long)pixlen + 5] =
               (lpixel[(long)pixlen + 5] + -1) / thistilesize[(long)pixlen + 5] + 1;
          if ((inc[(long)pixlen + 5] + -1) / thistilesize[(long)pixlen + 5] + 1 <
              tilesize[(long)pixlen + 5]) {
            local_350 = (inc[(long)pixlen + 5] + -1) / thistilesize[(long)pixlen + 5] + 1;
          }
          else {
            local_350 = tilesize[(long)pixlen + 5];
          }
          tfpixel[(long)pixlen + 5] = local_350;
          offset[(long)pixlen + 5] = local_250;
          local_250 = tilesize[(long)pixlen + 5] * local_250;
        }
        if (anynul != (int *)0x0) {
          *anynul = 0;
        }
        for (i4 = ftile[4]; i4 <= ltile[4]; i4 = i4 + 1) {
          tfpixel[4] = (i4 + -1) * tilesize[4] + 1;
          if (tfpixel[4] + tilesize[4] + -1 < naxis[4]) {
            local_358 = tfpixel[4] + tilesize[4] + -1;
          }
          else {
            local_358 = naxis[4];
          }
          tlpixel[4] = local_358;
          thistilesize[4] = (local_358 - tfpixel[4]) + 1;
          offset[4] = (i4 + -1) * rowdim[4];
          for (i3 = ftile[3]; i3 <= ltile[3]; i3 = i3 + 1) {
            tfpixel[3] = (i3 + -1) * tilesize[3] + 1;
            if (tfpixel[3] + tilesize[3] + -1 < naxis[3]) {
              local_360 = tfpixel[3] + tilesize[3] + -1;
            }
            else {
              local_360 = naxis[3];
            }
            tlpixel[3] = local_360;
            thistilesize[3] = thistilesize[4] * ((local_360 - tfpixel[3]) + 1);
            offset[3] = (i3 + -1) * rowdim[3] + offset[4];
            for (i2 = ftile[2]; i2 <= ltile[2]; i2 = i2 + 1) {
              tfpixel[2] = (i2 + -1) * tilesize[2] + 1;
              if (tfpixel[2] + tilesize[2] + -1 < naxis[2]) {
                local_368 = tfpixel[2] + tilesize[2] + -1;
              }
              else {
                local_368 = naxis[2];
              }
              tlpixel[2] = local_368;
              thistilesize[2] = thistilesize[3] * ((local_368 - tfpixel[2]) + 1);
              offset[2] = (i2 + -1) * rowdim[2] + offset[3];
              for (i1 = ftile[1]; i1 <= ltile[1]; i1 = i1 + 1) {
                tfpixel[1] = (i1 + -1) * tilesize[1] + 1;
                if (tfpixel[1] + tilesize[1] + -1 < naxis[1]) {
                  local_370 = tfpixel[1] + tilesize[1] + -1;
                }
                else {
                  local_370 = naxis[1];
                }
                tlpixel[1] = local_370;
                thistilesize[1] = thistilesize[2] * ((local_370 - tfpixel[1]) + 1);
                offset[1] = (i1 + -1) * rowdim[1] + offset[2];
                for (i0 = ftile[0]; i0 <= ltile[0]; i0 = i0 + 1) {
                  tfpixel[0] = (i0 + -1) * tilesize[0] + 1;
                  if (tfpixel[0] + tilesize[0] + -1 < naxis[0]) {
                    local_378 = tfpixel[0] + tilesize[0] + -1;
                  }
                  else {
                    local_378 = naxis[0];
                  }
                  tlpixel[0] = local_378;
                  thistilesize[0] = thistilesize[1] * ((local_378 - tfpixel[0]) + 1);
                  offset[0] = (i0 + -1) * rowdim[0] + offset[1];
                  for (irow = ltile[5]; irow <= tfpixel[5]; irow = irow + 1) {
                    tlpixel[5] = (irow + -1) * thistilesize[5] + 1;
                    if (tlpixel[5] + thistilesize[5] + -1 < tiledim[5]) {
                      local_380 = tlpixel[5] + thistilesize[5] + -1;
                    }
                    else {
                      local_380 = tiledim[5];
                    }
                    rowdim[5] = local_380;
                    iVar2 = (int)tlpixel[5];
                    iVar3 = (int)thistilesize[0];
                    _ndim = irow + offset[0];
                    iVar4 = imcomp_test_overlap(tilenul,tlpixel + 5,rowdim + 5,lpixel + 5,inc + 5,
                                                &i5,status);
                    if (iVar4 != 0) {
                      imcomp_decompress_tile
                                (fptr,(int)_ndim,iVar3 * (((int)local_380 - iVar2) + 1),datatype,
                                 local_5c,nullval,bnullarray,(char *)testnullval,(int *)&buffer,
                                 status);
                      if (((int)buffer != 0) && (anynul != (int *)0x0)) {
                        *anynul = 1;
                      }
                      imcomp_copy_overlap(bnullarray,buffer._4_4_,tilenul,tlpixel + 5,rowdim + 5,
                                          (char *)testnullval,(char *)array,lpixel + 5,inc + 5,&i5,
                                          local_5c,nullarray,status);
                    }
                  }
                }
              }
            }
          }
        }
        if (local_5c == 2) {
          free((void *)testnullval);
        }
        free(bnullarray);
        fptr_local._4_4_ = *status;
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_read_compressed_img(fitsfile *fptr,   /* I - FITS file pointer      */
            int  datatype,  /* I - datatype of the array to be returned      */
            LONGLONG  *infpixel, /* I - 'bottom left corner' of the subsection    */
            LONGLONG  *inlpixel, /* I - 'top right corner' of the subsection      */
            long  *ininc,    /* I - increment to be applied in each dimension */
            int  nullcheck,  /* I - 0 for no null checking                   */
                              /*     1: set undefined pixels = nullval       */
                              /*     2: set nullarray=1 for undefined pixels */
            void *nullval,    /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of flags = 1 if nullcheck = 2     */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
   Read a section of a compressed image;  Note: lpixel may be larger than the 
   size of the uncompressed image.  Only the pixels within the image will be
   returned.
*/
{
    long naxis[MAX_COMPRESS_DIM], tiledim[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM], thistilesize[MAX_COMPRESS_DIM];
    long ftile[MAX_COMPRESS_DIM], ltile[MAX_COMPRESS_DIM];
    long tfpixel[MAX_COMPRESS_DIM], tlpixel[MAX_COMPRESS_DIM];
    long rowdim[MAX_COMPRESS_DIM], offset[MAX_COMPRESS_DIM],ntemp;
    long fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long i5, i4, i3, i2, i1, i0, irow;
    int ii, ndim, pixlen, tilenul=0;
    void *buffer;
    char *bnullarray = 0;
    double testnullval = 0.;

    if (*status > 0) 
        return(*status);

    if (!fits_is_compressed_image(fptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_read_compressed_img)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    /* get temporary space for uncompressing one image tile */
    if (datatype == TSHORT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (short)); 
       pixlen = sizeof(short);
       if (nullval)
           testnullval = *(short *) nullval;
    }
    else if (datatype == TINT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (int));
       pixlen = sizeof(int);
       if (nullval)
           testnullval = *(int *) nullval;
    }
    else if (datatype == TLONG)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (long));
       pixlen = sizeof(long);
       if (nullval)
           testnullval = *(long *) nullval;
    }
    else if (datatype == TFLOAT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (float));
       pixlen = sizeof(float);
       if (nullval)
           testnullval = *(float *) nullval;
    }
    else if (datatype == TDOUBLE)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (double));
       pixlen = sizeof(double);
       if (nullval)
           testnullval = *(double *) nullval;
    }
    else if (datatype == TUSHORT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (unsigned short));
       pixlen = sizeof(short);
       if (nullval)
           testnullval = *(unsigned short *) nullval;
    }
    else if (datatype == TUINT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (unsigned int));
       pixlen = sizeof(int);
       if (nullval)
           testnullval = *(unsigned int *) nullval;
    }
    else if (datatype == TULONG)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (unsigned long));
       pixlen = sizeof(long);
       if (nullval)
           testnullval = *(unsigned long *) nullval;
    }
    else if (datatype == TBYTE || datatype == TSBYTE)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (char));
       pixlen = 1;
       if (nullval)
           testnullval = *(unsigned char *) nullval;
    }
    else
    {
        ffpmsg("unsupported datatype for uncompressing image");
        return(*status = BAD_DATATYPE);
    }

    /* If nullcheck ==1 and nullval == 0, then this means that the */
    /* calling routine does not want to check for null pixels in the array */
    if (nullcheck == 1 && testnullval == 0.)
        nullcheck = 0;

    if (buffer == NULL)
    {
	    ffpmsg("Out of memory (fits_read_compress_img)");
	    return (*status = MEMORY_ALLOCATION);
    }
	
    /* allocate memory for a null flag array, if needed */
    if (nullcheck == 2)
    {
        bnullarray = calloc ((fptr->Fptr)->maxtilelen, sizeof (char));

        if (bnullarray == NULL)
        {
	    ffpmsg("Out of memory (fits_read_compress_img)");
            free(buffer);
	    return (*status = MEMORY_ALLOCATION);
        }
    }

    /* initialize all the arrays */
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxis[ii] = 1;
        tiledim[ii] = 1;
        tilesize[ii] = 1;
        ftile[ii] = 1;
        ltile[ii] = 1;
        rowdim[ii] = 1;
    }

    ndim = (fptr->Fptr)->zndim;
    ntemp = 1;
    for (ii = 0; ii < ndim; ii++)
    {
        /* support for mirror-reversed image sections */
        if (infpixel[ii] <= inlpixel[ii])
        {
           fpixel[ii] = (long) infpixel[ii];
           lpixel[ii] = (long) inlpixel[ii];
           inc[ii]    = ininc[ii];
        }
        else
        {
           fpixel[ii] = (long) inlpixel[ii];
           lpixel[ii] = (long) infpixel[ii];
           inc[ii]    = -ininc[ii];
        }

        /* calc number of tiles in each dimension, and tile containing */
        /* the first and last pixel we want to read in each dimension  */
        naxis[ii] = (fptr->Fptr)->znaxis[ii];
        if (fpixel[ii] < 1)
        {
            if (nullcheck == 2)
            {
                free(bnullarray);
            }
            free(buffer);
            return(*status = BAD_PIX_NUM);
        }

        tilesize[ii] = (fptr->Fptr)->tilesize[ii];
        tiledim[ii] = (naxis[ii] - 1) / tilesize[ii] + 1;
        ftile[ii]   = (fpixel[ii] - 1)   / tilesize[ii] + 1;
        ltile[ii]   = minvalue((lpixel[ii] - 1) / tilesize[ii] + 1, 
                                tiledim[ii]);
        rowdim[ii]  = ntemp;  /* total tiles in each dimension */
        ntemp *= tiledim[ii];
    }

    if (anynul)
       *anynul = 0;  /* initialize */

    /* support up to 6 dimensions for now */
    /* tfpixel and tlpixel are the first and last image pixels */
    /* along each dimension of the compression tile */
    for (i5 = ftile[5]; i5 <= ltile[5]; i5++)
    {
     tfpixel[5] = (i5 - 1) * tilesize[5] + 1;
     tlpixel[5] = minvalue(tfpixel[5] + tilesize[5] - 1, 
                            naxis[5]);
     thistilesize[5] = tlpixel[5] - tfpixel[5] + 1;
     offset[5] = (i5 - 1) * rowdim[5];
     for (i4 = ftile[4]; i4 <= ltile[4]; i4++)
     {
      tfpixel[4] = (i4 - 1) * tilesize[4] + 1;
      tlpixel[4] = minvalue(tfpixel[4] + tilesize[4] - 1, 
                            naxis[4]);
      thistilesize[4] = thistilesize[5] * (tlpixel[4] - tfpixel[4] + 1);
      offset[4] = (i4 - 1) * rowdim[4] + offset[5];
      for (i3 = ftile[3]; i3 <= ltile[3]; i3++)
      {
        tfpixel[3] = (i3 - 1) * tilesize[3] + 1;
        tlpixel[3] = minvalue(tfpixel[3] + tilesize[3] - 1, 
                              naxis[3]);
        thistilesize[3] = thistilesize[4] * (tlpixel[3] - tfpixel[3] + 1);
        offset[3] = (i3 - 1) * rowdim[3] + offset[4];
        for (i2 = ftile[2]; i2 <= ltile[2]; i2++)
        {
          tfpixel[2] = (i2 - 1) * tilesize[2] + 1;
          tlpixel[2] = minvalue(tfpixel[2] + tilesize[2] - 1, 
                                naxis[2]);
          thistilesize[2] = thistilesize[3] * (tlpixel[2] - tfpixel[2] + 1);
          offset[2] = (i2 - 1) * rowdim[2] + offset[3];
          for (i1 = ftile[1]; i1 <= ltile[1]; i1++)
          {
            tfpixel[1] = (i1 - 1) * tilesize[1] + 1;
            tlpixel[1] = minvalue(tfpixel[1] + tilesize[1] - 1, 
                                  naxis[1]);
            thistilesize[1] = thistilesize[2] * (tlpixel[1] - tfpixel[1] + 1);
            offset[1] = (i1 - 1) * rowdim[1] + offset[2];
            for (i0 = ftile[0]; i0 <= ltile[0]; i0++)
            {
             tfpixel[0] = (i0 - 1) * tilesize[0] + 1;
             tlpixel[0] = minvalue(tfpixel[0] + tilesize[0] - 1, 
                                    naxis[0]);
              thistilesize[0] = thistilesize[1] * (tlpixel[0] - tfpixel[0] + 1);
              /* calculate row of table containing this tile */
              irow = i0 + offset[1];

/*
printf("row %d, %d %d, %d %d, %d %d; %d\n",
              irow, tfpixel[0],tlpixel[0],tfpixel[1],tlpixel[1],tfpixel[2],tlpixel[2],
	      thistilesize[0]);
*/   
              /* test if there are any intersecting pixels in this tile and the output image */
              if (imcomp_test_overlap(ndim, tfpixel, tlpixel, 
                      fpixel, lpixel, inc, status)) {
                  /* read and uncompress this row (tile) of the table */
                  /* also do type conversion and undefined pixel substitution */
                  /* at this point */

                  imcomp_decompress_tile(fptr, irow, thistilesize[0],
                    datatype, nullcheck, nullval, buffer, bnullarray, &tilenul,
                     status);

                  if (tilenul && anynul)
                      *anynul = 1;  /* there are null pixels */
/*
printf(" pixlen=%d, ndim=%d, %d %d %d, %d %d %d, %d %d %d\n",
     pixlen, ndim, fpixel[0],lpixel[0],inc[0],fpixel[1],lpixel[1],inc[1],
     fpixel[2],lpixel[2],inc[2]);
*/
                  /* copy the intersecting pixels from this tile to the output */
                  imcomp_copy_overlap(buffer, pixlen, ndim, tfpixel, tlpixel, 
                     bnullarray, array, fpixel, lpixel, inc, nullcheck, 
                     nullarray, status);
               }
            }
          }
        }
      }
     }
    }
    if (nullcheck == 2)
    {
        free(bnullarray);
    }
    free(buffer);

    return(*status);
}